

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server_socket.c
# Opt level: O0

cio_error cio_server_socket_accept
                    (cio_server_socket *server_socket,cio_accept_handler_t handler,
                    void *handler_context)

{
  int iVar1;
  int *piVar2;
  int ret;
  cio_error err;
  void *handler_context_local;
  cio_accept_handler_t handler_local;
  cio_server_socket *server_socket_local;
  
  if (handler == (cio_accept_handler_t)0x0) {
    server_socket_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    server_socket->handler = handler;
    server_socket->handler_context = handler_context;
    (server_socket->impl).ev.read_callback = accept_callback;
    (server_socket->impl).ev.context = server_socket;
    iVar1 = listen((server_socket->impl).ev.fd,server_socket->backlog);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      server_socket_local._4_4_ = -*piVar2;
    }
    else {
      server_socket_local._4_4_ =
           cio_linux_eventloop_add((server_socket->impl).loop,&(server_socket->impl).ev);
      if (server_socket_local._4_4_ == CIO_SUCCESS) {
        server_socket_local._4_4_ =
             cio_linux_eventloop_register_read((server_socket->impl).loop,&(server_socket->impl).ev)
        ;
      }
    }
  }
  return server_socket_local._4_4_;
}

Assistant:

enum cio_error cio_server_socket_accept(struct cio_server_socket *server_socket, cio_accept_handler_t handler, void *handler_context)
{
	enum cio_error err = CIO_SUCCESS;
	if (cio_unlikely(handler == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	server_socket->handler = handler;
	server_socket->handler_context = handler_context;
	server_socket->impl.ev.read_callback = accept_callback;
	server_socket->impl.ev.context = server_socket;

#if defined __GNUC__ && !defined __clang__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wanalyzer-fd-leak"
#endif
	int ret = listen(server_socket->impl.ev.fd, server_socket->backlog);
	if (cio_unlikely(ret < 0)) {
		return (enum cio_error)(-errno);
	}

	err = cio_linux_eventloop_add(server_socket->impl.loop, &server_socket->impl.ev);
#if defined __GNUC__ && !defined __clang__
#pragma GCC diagnostic pop
#endif
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	err = cio_linux_eventloop_register_read(server_socket->impl.loop, &server_socket->impl.ev);
	return err;
}